

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::StyledWriter::isMultineArray(StyledWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  int iVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  int index_1;
  int lineLength;
  Value *childValue;
  int index;
  bool isMultiLine;
  int size;
  Value *in_stack_000001c8;
  StyledWriter *in_stack_000001d0;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined4 local_30;
  undefined4 local_2c;
  Value *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar6;
  
  AVar2 = Value::size(in_stack_ffffffffffffffd8);
  uVar6 = CONCAT13(*(int *)(in_RDI + 0x60) <= (int)(AVar2 * 3),(int3)in_stack_ffffffffffffffe8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x12d535);
  iVar5 = 0;
  do {
    local_39 = 0;
    if (iVar5 < (int)AVar2) {
      local_39 = (byte)(uVar6 >> 0x18) ^ 0xff;
    }
    if ((local_39 & 1) == 0) {
      if ((uVar6 & 0x1000000) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(in_RSI,CONCAT44(AVar2,uVar6));
        *(undefined1 *)(in_RDI + 0x68) = 1;
        local_2c = (AVar2 - 1) * 2 + 4;
        for (local_30 = 0; local_30 < (int)AVar2; local_30 = local_30 + 1) {
          Value::operator[]((Value *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                            (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
          writeValue(in_stack_000001d0,in_stack_000001c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 8),(long)local_30);
          iVar4 = std::__cxx11::string::length();
          local_2c = iVar4 + local_2c;
        }
        *(undefined1 *)(in_RDI + 0x68) = 0;
        local_3c = true;
        if ((uVar6 & 0x1000000) == 0) {
          local_3c = *(int *)(in_RDI + 0x60) <= local_2c;
        }
        uVar6 = (uint)local_3c << 0x18;
      }
      return (bool)((byte)(uVar6 >> 0x18) & 1);
    }
    in_stack_ffffffffffffffd8 =
         Value::operator[]((Value *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                           (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    local_3a = true;
    if ((uVar6 & 0x1000000) == 0) {
      bVar1 = Value::isArray(in_stack_ffffffffffffffd8);
      if (bVar1) {
LAB_0012d5a8:
        AVar3 = Value::size(in_stack_ffffffffffffffd8);
        local_3b = AVar3 != 0;
      }
      else {
        bVar1 = Value::isObject(in_stack_ffffffffffffffd8);
        local_3b = false;
        if (bVar1) goto LAB_0012d5a8;
      }
      local_3a = local_3b;
    }
    uVar6 = CONCAT13(local_3a,(int3)uVar6);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool StyledWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}